

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Builder.h
# Opt level: O0

void __thiscall arangodb::velocypack::Builder::addUInt(Builder *this,uint64_t v)

{
  Builder *in_RSI;
  undefined8 in_RDI;
  uint8_t unaff_retaddr;
  
  if (in_RSI < (Builder *)0xa) {
    appendByte(in_RSI,(uint8_t)((ulong)in_RDI >> 0x38));
  }
  else {
    appendUInt(this,v,unaff_retaddr);
  }
  return;
}

Assistant:

void addUInt(uint64_t v) {
    if (v <= 9) {
      // SmallInt
      appendByte(static_cast<uint8_t>(0x30 + v));
    } else {
      // regular UInt
      appendUInt(v, 0x27);
    }
  }